

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O3

void Search::search_timer(position *p,limits *lims)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  timespec local_38;
  double local_28;
  
  lVar3 = std::chrono::_V2::system_clock::now();
  uVar1 = lims->movetime;
  local_28 = estimate_max_time(p,lims);
  if (uVar1 == 0) {
    if (local_28 <= -1.0) {
      do {
        lVar4 = std::chrono::_V2::system_clock::now();
        lVar4 = lVar4 - lVar3;
        lVar3 = std::chrono::_V2::system_clock::now();
        elapsed = ((double)lVar4 / 1000000000.0) * 1000.0 + elapsed;
        local_38.tv_sec = 0;
        local_38.tv_nsec = 1000000;
        do {
          iVar2 = nanosleep(&local_38,&local_38);
          if (iVar2 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
      } while ((UCI_SIGNALS.stop == false) && ((searching & 1) != 0));
    }
    else {
      do {
        lVar4 = std::chrono::_V2::system_clock::now();
        lVar4 = lVar4 - lVar3;
        lVar3 = std::chrono::_V2::system_clock::now();
        elapsed = ((double)lVar4 / 1000000000.0) * 1000.0 + elapsed;
        local_38.tv_sec = 0;
        local_38.tv_nsec = 1000000;
        do {
          iVar2 = nanosleep(&local_38,&local_38);
          if (iVar2 != -1) break;
          piVar5 = __errno_location();
        } while (*piVar5 == 4);
      } while (((UCI_SIGNALS.stop == false) && ((searching & 1) != 0)) && (elapsed <= local_28));
    }
  }
  else {
    do {
      lVar4 = std::chrono::_V2::system_clock::now();
      lVar4 = lVar4 - lVar3;
      lVar3 = std::chrono::_V2::system_clock::now();
      elapsed = ((double)lVar4 / 1000000000.0) * 1000.0 + elapsed;
      local_38.tv_sec = 0;
      local_38.tv_nsec = 1000000;
      do {
        iVar2 = nanosleep(&local_38,&local_38);
        if (iVar2 != -1) break;
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
    } while (((UCI_SIGNALS.stop == false) && ((searching & 1) != 0)) &&
            (elapsed <= (double)lims->movetime));
  }
  UCI_SIGNALS.stop = true;
  return;
}

Assistant:

void Search::search_timer(position& p, limits& lims) {
	util::clock c;
	c.start();
	bool fixed_time = lims.movetime > 0;
	int delay = 1; // ms
	double time_limit = estimate_max_time(p, lims);
	auto sleep = [delay]() { std::this_thread::sleep_for(std::chrono::milliseconds(delay)); };

	if (fixed_time) {
		do {
			elapsed += c.elapsed_ms();
			sleep();
		} while (!UCI_SIGNALS.stop && searching && elapsed <= lims.movetime);
	}
	else if (time_limit > -1) {
		// dynamic time estimate in a real game
		do {
			elapsed += c.elapsed_ms();
			sleep();
		} while (!UCI_SIGNALS.stop && searching && elapsed <= time_limit);
	}
	else {
		do {
			// analysis mode (infinite time)
			elapsed += c.elapsed_ms();
			sleep();
		} while (!UCI_SIGNALS.stop && searching);
	}
	UCI_SIGNALS.stop = true;
	return;
}